

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O3

void __thiscall hwnet::TCPListener::Do(TCPListener *this)

{
  mutex *__mutex;
  int iVar1;
  uchar auVar2 [8];
  uchar auVar3 [8];
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  undefined1 auStack_e8 [8];
  Addr addr;
  sockaddr addr_;
  shared_ptr<hwnet::TCPListener> local_58;
  __weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *local_48;
  int local_3c;
  int local_38;
  socklen_t local_34;
  int fd_;
  socklen_t len;
  
  __mutex = &this->mtx;
  local_48 = (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<hwnet::TCPListener>;
  while( true ) {
    uVar4 = (this->addr).addrType - 1;
    local_34 = 0;
    if (uVar4 < 3) {
      local_34 = *(socklen_t *)(&DAT_001168f8 + (ulong)uVar4 * 4);
    }
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar5 != 0) break;
    iVar1 = this->readableVer;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar5 = accept(this,(int)&local_38,(sockaddr *)&addr.addrType,&local_34);
    if (iVar5 == 0xb) {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) break;
      if (iVar1 == this->readableVer) {
        this->doing = false;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else if (iVar5 == 0) {
      std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPListener,void>
                ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)&local_58,local_48);
      iVar5 = local_38;
      auStack_e8._0_4_ = 0;
      auStack_e8._4_4_ = 0;
      addr.sockaddr._0_4_ = 0;
      addr.sockaddr.in6.sin6_flowinfo = 0;
      addr.sockaddr._8_4_ = 0;
      addr.sockaddr._12_4_ = 0;
      auVar3[0] = '\0';
      auVar3[1] = '\0';
      auVar3[2] = '\0';
      auVar3[3] = '\0';
      auVar3[4] = '\0';
      auVar3[5] = '\0';
      auVar3[6] = '\0';
      auVar3[7] = '\0';
      auVar2[0] = '\0';
      auVar2[1] = '\0';
      auVar2[2] = '\0';
      auVar2[3] = '\0';
      auVar2[4] = '\0';
      auVar2[5] = '\0';
      auVar2[6] = '\0';
      auVar2[7] = '\0';
      addr.sockaddr._16_4_ = 0;
      addr.sockaddr._20_4_ = 0;
      addr.sockaddr._24_8_ = 0;
      addr.sockaddr._32_8_ = 0;
      addr.sockaddr._40_8_ = 0;
      addr.sockaddr._48_8_ = 0;
      addr.sockaddr._56_8_ = 0;
      addr.sockaddr._64_8_ = 0;
      addr.sockaddr._72_8_ = 0;
      addr.sockaddr._80_8_ = 0;
      addr.sockaddr._88_8_ = 0;
      addr.sockaddr._96_8_ = 0;
      addr.sockaddr._104_8_ = 0;
      if (local_34 == 0x6e) {
        addr.sockaddr._104_8_ = 0x100000003;
        memcpy(auStack_e8,&addr.addrType,0x6e);
      }
      else if (local_34 == 0x1c) {
        addr.sockaddr._104_8_ = 0xa00000002;
        auStack_e8._0_4_ = addr.addrType;
        auStack_e8._4_4_ = addr.family;
        addr.sockaddr._0_4_ = addr_._0_4_;
        addr.sockaddr.in.sin_addr.s_addr = (in_addr)(in_addr)addr_.sa_data._2_4_;
        addr.sockaddr._16_4_ =
             (int)local_58.super___shared_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        addr.sockaddr.in.sin_zero = (uchar  [8])&this->onNewConn_;
      }
      else {
        addr.sockaddr.in.sin_zero = auVar2;
        if (local_34 == 0x10) {
          addr.sockaddr._104_8_ = 0x200000001;
          auStack_e8._0_4_ = addr.addrType;
          auStack_e8._4_4_ = addr.family;
          addr.sockaddr._0_4_ = addr_._0_4_;
          addr.sockaddr.in.sin_addr.s_addr = (in_addr)(in_addr)addr_.sa_data._2_4_;
          addr.sockaddr.in.sin_zero = auVar3;
        }
      }
      local_3c = iVar5;
      if ((this->onNewConn_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
LAB_00114493:
        uVar6 = std::__throw_bad_function_call();
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_));
        }
        _Unwind_Resume(uVar6);
      }
      (*(this->onNewConn_)._M_invoker)
                ((_Any_data *)&this->onNewConn_,&local_58,&local_3c,(Addr *)auStack_e8);
      if (local_58.super___shared_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else if ((this->onError_).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPListener,void>
                ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)auStack_e8,local_48)
      ;
      local_58.super___shared_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           iVar5;
      if ((this->onError_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->onError_)._M_invoker)
                  ((_Any_data *)&this->onError_,(shared_ptr<hwnet::TCPListener> *)auStack_e8,
                   (int *)&local_58);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_) ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_));
        return;
      }
      goto LAB_00114493;
    }
    if (((this->stop)._M_base._M_i & 1U) != 0) {
      return;
    }
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void TCPListener::Do() {
	for(;;) {
		struct sockaddr addr_;
		socklen_t len = this->addr.AddrLen();
		int       fd_;
		this->mtx.lock();		
		auto localVer = this->readableVer;
		this->mtx.unlock();
		auto err = this->accept(&fd_,&addr_,&len);
		if(0 == err) {
			this->onNewConn_(shared_from_this(),fd_,Addr::MakeBySockAddr(&addr_,len));
		} else {
			if(err == EAGAIN) {
				std::lock_guard<std::mutex> guard(this->mtx);
				if(localVer == this->readableVer) {
					this->doing = false;
					break;
				}
			} else {
				if(nullptr != this->onError_){
					this->onError_(shared_from_this(),err);
					break;
				}
			}
		}
		if(this->stop.load() == true) {
			break;
		}
	}
}